

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipTimer.h
# Opt level: O2

void __thiscall MipTimer::reportMipCoreClock(MipTimer *this,HighsTimerClock *mip_timer_clock)

{
  initializer_list<int> __l;
  allocator_type local_59;
  _Vector_base<int,_std::allocator<int>_> local_58;
  vector<int,_std::allocator<int>_> mip_clock_list;
  int local_24 [3];
  
  local_24[0] = 1;
  local_24[1] = 2;
  local_24[2] = 3;
  __l._M_len = 3;
  __l._M_array = local_24;
  std::vector<int,_std::allocator<int>_>::vector(&mip_clock_list,__l,&local_59);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_58,&mip_clock_list);
  reportMipClockList(this,"MipCore_",(vector<int,_std::allocator<int>_> *)&local_58,mip_timer_clock,
                     0,-1.0);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_58);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&mip_clock_list.super__Vector_base<int,_std::allocator<int>_>);
  return;
}

Assistant:

void reportMipCoreClock(const HighsTimerClock& mip_timer_clock) {
    //    const std::vector<HighsInt>& clock = mip_timer_clock.clock_;
    const std::vector<HighsInt> mip_clock_list{
        kMipClockPresolve, kMipClockSolve, kMipClockPostsolve};
    reportMipClockList("MipCore_", mip_clock_list, mip_timer_clock,
                       kMipClockTotal);
  }